

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.hpp
# Opt level: O2

void __thiscall
ranger::event::tcp_connection::tcp_connection(tcp_connection *this,tcp_connection *rhs)

{
  bufferevent *pbVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  pbVar1 = rhs->m_base_bev;
  this->m_top_bev = rhs->m_top_bev;
  this->m_base_bev = pbVar1;
  (this->m_token_bucket).
  super___shared_ptr<const_ranger::event::token_bucket_cfg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (rhs->m_token_bucket).
           super___shared_ptr<const_ranger::event::token_bucket_cfg,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (rhs->m_token_bucket).
           super___shared_ptr<const_ranger::event::token_bucket_cfg,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (rhs->m_token_bucket).
  super___shared_ptr<const_ranger::event::token_bucket_cfg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_token_bucket).
  super___shared_ptr<const_ranger::event::token_bucket_cfg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->m_token_bucket).
  super___shared_ptr<const_ranger::event::token_bucket_cfg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  (rhs->m_token_bucket).
  super___shared_ptr<const_ranger::event::token_bucket_cfg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::function<void_(ranger::event::tcp_connection_&,_ranger::event::tcp_connection::event_code)>::
  function(&this->m_event_handler,&rhs->m_event_handler);
  this->m_extra_data = rhs->m_extra_data;
  ranger::event::tcp_connection::reset_callbacks();
  rhs->m_extra_data = (void *)0x0;
  rhs->m_top_bev = (bufferevent *)0x0;
  rhs->m_base_bev = (bufferevent *)0x0;
  return;
}

Assistant:

tcp_connection(tcp_connection&& rhs) noexcept
		: m_top_bev(rhs.m_top_bev)
		, m_base_bev(rhs.m_base_bev)
		, m_token_bucket(std::move(rhs.m_token_bucket))
		, m_event_handler(std::move(rhs.m_event_handler))
		, m_extra_data(rhs.m_extra_data) {
		reset_callbacks();
		rhs.m_top_bev = nullptr;
		rhs.m_base_bev = nullptr;
		rhs.m_extra_data = nullptr;
	}